

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::SchemaLoader(SchemaLoader *this)

{
  Disposer *local_18;
  Impl *local_10;
  
  kj::heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&>((kj *)&local_18,this);
  kj::_::Mutex::Mutex((Mutex *)this);
  (this->impl).value.disposer = local_18;
  (this->impl).value.ptr = local_10;
  return;
}

Assistant:

SchemaLoader::SchemaLoader(): impl(kj::heap<Impl>(*this)) {}